

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

bool re2::IsAnchorStart(Regexp **pre,int depth)

{
  uint8 uVar1;
  ushort uVar2;
  bool bVar3;
  int cap;
  Regexp *in_RAX;
  Regexp **sub_00;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  Regexp *pRVar5;
  Regexp *this;
  int i;
  ulong uVar6;
  Regexp *sub;
  
  this = *pre;
  if (3 < depth || this == (Regexp *)0x0) {
    return false;
  }
  uVar1 = this->op_;
  if (uVar1 == '\x12') {
    sub = in_RAX;
    pRVar5 = Regexp::LiteralString((Rune *)0x0,0,(uint)this->parse_flags_);
LAB_001258d8:
    *pre = pRVar5;
  }
  else {
    if (uVar1 == '\v') {
      if (this->nsub_ < 2) {
        paVar4 = &this->field_5;
      }
      else {
        paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      sub = Regexp::Incref(paVar4->subone_);
      bVar3 = IsAnchorStart(&sub,depth + 1);
      pRVar5 = sub;
      if (!bVar3) {
        bVar3 = false;
        this = sub;
        goto LAB_00125906;
      }
      uVar2 = this->parse_flags_;
      cap = Regexp::cap(this);
      pRVar5 = Regexp::Capture(pRVar5,(uint)uVar2,cap);
      goto LAB_001258d8;
    }
    if (uVar1 != '\x05') {
      return false;
    }
    if (this->nsub_ == 0) {
      return false;
    }
    paVar4 = &this->field_5;
    if (this->nsub_ != 1) {
      paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    sub = Regexp::Incref(paVar4->subone_);
    bVar3 = IsAnchorStart(&sub,depth + 1);
    if (!bVar3) {
      bVar3 = false;
      this = sub;
      goto LAB_00125906;
    }
    uVar2 = this->nsub_;
    sub_00 = (Regexp **)operator_new__((ulong)uVar2 << 3);
    *sub_00 = sub;
    for (uVar6 = 1; uVar6 < uVar2; uVar6 = uVar6 + 1) {
      paVar4 = &this->field_5;
      if (1 < uVar2) {
        paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      pRVar5 = Regexp::Incref(paVar4[uVar6].subone_);
      sub_00[uVar6] = pRVar5;
      uVar2 = this->nsub_;
    }
    pRVar5 = Regexp::Concat(sub_00,(uint)uVar2,(uint)this->parse_flags_);
    *pre = pRVar5;
    operator_delete__(sub_00);
  }
  bVar3 = true;
LAB_00125906:
  Regexp::Decref(this);
  return bVar3;
}

Assistant:

static bool IsAnchorStart(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorStart is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[0]->Incref();
        if (IsAnchorStart(&sub, depth+1)) {
          Regexp** subcopy = new Regexp*[re->nsub()];
          subcopy[0] = sub;  // already have reference
          for (int i = 1; i < re->nsub(); i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy, re->nsub(), re->parse_flags());
          delete[] subcopy;
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorStart(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpBeginText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}